

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

void __thiscall QIconLoader::invalidateKey(QIconLoader *this)

{
  this->m_themeKey = this->m_themeKey + 1;
  if ((this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged == true) {
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = false;
  }
  return;
}

Assistant:

void QIconLoader::invalidateKey()
{
    // Invalidating the key here will result in QThemeIconEngine
    // recreating the actual engine the next time the icon is used.
    // We don't need to clear the QIcon cache itself.
    m_themeKey++;

    // invalidating the factory results in us looking once for
    // a plugin that provides icon for the new themeName()
    m_factory = std::nullopt;
}